

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O2

ostream * boost::unit_test::utils::operator<<
                    (custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::cdata_t>_>
                     *p,const_string *value)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  basic_cstring<const_char> local_38;
  const_string local_28;
  
  local_38.m_begin = "<![CDATA[";
  local_38.m_end = "";
  unit_test::operator<<(p->m_ostr,&local_38);
  local_28.m_begin = value->m_begin;
  local_28.m_end = value->m_end;
  print_escaped_cdata(p->m_ostr,&local_28);
  local_38.m_begin = "]]>";
  local_38.m_end = "";
  pbVar1 = unit_test::operator<<(p->m_ostr,&local_38);
  return pbVar1;
}

Assistant:

inline std::ostream&
operator<<( custom_printer<cdata> const& p, const_string value )
{
    *p << BOOST_TEST_L( "<![CDATA[" );
    print_escaped_cdata( *p, value );
    return  *p << BOOST_TEST_L( "]]>" );
}